

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactNameTag>::Evaluate
          (string *__return_storage_ptr__,
          TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactNameTag> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar1;
  undefined1 local_80 [8];
  string result;
  cmGeneratorTarget *local_40;
  cmGeneratorTarget *target;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactNameTag> *this_local;
  
  target = (cmGeneratorTarget *)dagChecker;
  dagChecker_local = (cmGeneratorExpressionDAGChecker *)content;
  content_local = (GeneratorExpressionContent *)context;
  context_local = (cmGeneratorExpressionContext *)parameters;
  parameters_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactNameTag> *)
               __return_storage_ptr__;
  local_40 = TargetArtifactBase::GetTarget
                       (&this->super_TargetArtifactBase,parameters,context,content,dagChecker);
  if (local_40 == (cmGeneratorTarget *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::
    set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>::
    insert((set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
            *)&(content_local->IdentifierChildren).
               super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_40);
    pVar1 = std::
            set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
            ::insert((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                      *)&content_local->ContentLength,&local_40);
    result.field_2._8_8_ = pVar1.first._M_node;
    TargetFilesystemArtifactResultCreator<ArtifactSonameTag>::Create_abi_cxx11_
              ((string *)local_80,
               (TargetFilesystemArtifactResultCreator<ArtifactSonameTag> *)local_40,
               (cmGeneratorTarget *)content_local,(cmGeneratorExpressionContext *)dagChecker_local,
               (GeneratorExpressionContent *)dagChecker);
    if (((ulong)content_local[4].StartContent & 0x100) == 0) {
      TargetFilesystemArtifactResultGetter<ArtifactNameTag>::Get
                (__return_storage_ptr__,(string *)local_80);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const override
  {
    cmGeneratorTarget* target =
      this->GetTarget(parameters, context, content, dagChecker);
    if (!target) {
      return std::string();
    }
    context->DependTargets.insert(target);
    context->AllTargets.insert(target);

    std::string result =
      TargetFilesystemArtifactResultCreator<ArtifactT>::Create(target, context,
                                                               content);
    if (context->HadError) {
      return std::string();
    }
    return TargetFilesystemArtifactResultGetter<ComponentT>::Get(result);
  }